

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O1

void __thiscall
OpenMD::StringTokenizer::StringTokenizer
          (StringTokenizer *this,string *str,string *delim,bool returnTokens)

{
  pointer pcVar1;
  
  (this->tokenString_)._M_dataplus._M_p = (pointer)&(this->tokenString_).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + str->_M_string_length);
  (this->delim_)._M_dataplus._M_p = (pointer)&(this->delim_).field_2;
  pcVar1 = (delim->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->delim_,pcVar1,pcVar1 + delim->_M_string_length);
  this->returnTokens_ = returnTokens;
  pcVar1 = (this->tokenString_)._M_dataplus._M_p;
  (this->currentPos_)._M_current = pcVar1;
  (this->end_)._M_current = pcVar1 + (this->tokenString_)._M_string_length;
  return;
}

Assistant:

StringTokenizer::StringTokenizer(const std::string& str,
                                   const std::string& delim,
                                   bool returnTokens) :
      tokenString_(str),
      delim_(delim), returnTokens_(returnTokens),
      currentPos_(tokenString_.begin()), end_(tokenString_.end()) {}